

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

shared_ptr<Pipeline> __thiscall QPDFLogger::standardError(QPDFLogger *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RSI;
  shared_ptr<Pipeline> sVar2;
  QPDFLogger *this_local;
  
  peVar1 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RSI);
  std::shared_ptr<Pipeline>::shared_ptr((shared_ptr<Pipeline> *)this,&peVar1->p_stderr);
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
QPDFLogger::standardError()
{
    return m->p_stderr;
}